

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

file_status __thiscall ghc::filesystem::symlink_status(filesystem *this,path *p)

{
  file_type fVar1;
  int code;
  filesystem_error *this_00;
  error_code ec_00;
  string local_50;
  undefined1 local_29;
  undefined1 auStack_28 [8];
  error_code ec;
  path *p_local;
  file_status *result;
  
  ec._M_cat = (error_category *)p;
  std::error_code::error_code((error_code *)auStack_28);
  local_29 = 0;
  symlink_status(this,(path *)ec._M_cat,(error_code *)auStack_28);
  fVar1 = file_status::type((file_status *)this);
  if (fVar1 != none) {
    return (file_status)this;
  }
  this_00 = (filesystem_error *)__cxa_allocate_exception(0x90);
  code = std::error_code::value((error_code *)auStack_28);
  detail::systemErrorText<int>(&local_50,code);
  ec_00._0_8_ = (ulong)auStack_28 & 0xffffffff;
  ec_00._M_cat = (error_category *)ec._0_8_;
  filesystem_error::filesystem_error(this_00,&local_50,ec_00);
  __cxa_throw(this_00,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE file_status symlink_status(const path& p)
{
    std::error_code ec;
    auto result = symlink_status(p, ec);
    if (result.type() == file_type::none) {
        throw filesystem_error(detail::systemErrorText(ec.value()), ec);
    }
    return result;
}